

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

void __thiscall Trie::insert(Trie *this,char *text,size_t value)

{
  undefined8 uVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type_conflict *pmVar4;
  reference pvVar5;
  undefined1 local_70 [8];
  LookupEntry lookupEntry_1;
  Node newNode;
  _Self local_40;
  iterator it;
  LookupEntry lookupEntry;
  size_t node;
  size_t value_local;
  char *text_local;
  Trie *this_local;
  
  lookupEntry.input = '\0';
  lookupEntry._9_7_ = 0;
  for (value_local = (size_t)text; *(char *)value_local != '\0'; value_local = value_local + 1) {
    it._M_node = (_Base_ptr)lookupEntry._8_8_;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
         ::find(&this->lookup,(key_type *)&it);
    newNode.value =
         (size_t)std::
                 map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
                 ::end(&this->lookup);
    bVar2 = std::operator==(&local_40,(_Self *)&newNode.value);
    if (bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>::operator->
                       (&local_40);
    lookupEntry._8_8_ = ppVar3->second;
  }
  for (; *(char *)value_local != '\0'; value_local = value_local + 1) {
    lookupEntry_1._8_8_ = std::vector<Trie::Node,_std::allocator<Trie::Node>_>::size(&this->nodes);
    newNode.index._0_1_ = 0;
    newNode.hasValue = false;
    newNode._9_7_ = 0;
    std::vector<Trie::Node,_std::allocator<Trie::Node>_>::push_back
              (&this->nodes,(value_type *)&lookupEntry_1.input);
    uVar1 = lookupEntry_1._8_8_;
    local_70 = (undefined1  [8])lookupEntry._8_8_;
    lookupEntry_1.node._0_1_ = *(undefined1 *)value_local;
    pmVar4 = std::
             map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
             ::operator[](&this->lookup,(key_type *)local_70);
    *pmVar4 = uVar1;
    lookupEntry.input = lookupEntry_1.input;
    lookupEntry._9_7_ = lookupEntry_1._9_7_;
  }
  pvVar5 = std::vector<Trie::Node,_std::allocator<Trie::Node>_>::operator[]
                     (&this->nodes,lookupEntry._8_8_);
  pvVar5->hasValue = true;
  pvVar5 = std::vector<Trie::Node,_std::allocator<Trie::Node>_>::operator[]
                     (&this->nodes,lookupEntry._8_8_);
  pvVar5->value = value;
  return;
}

Assistant:

void Trie::insert(const char* text, size_t value)
{
	size_t node = 0;	// root node

	// traverse existing nodes
	while (*text != 0)
	{
		LookupEntry lookupEntry { node, *text };
		auto it = lookup.find(lookupEntry);
		if (it == lookup.end())
			break;

		node = it->second;
		text++;
	}

	// add new nodes as necessary
	while (*text != 0)
	{
		Node newNode { nodes.size(), false, 0 };
		nodes.push_back(newNode);

		LookupEntry lookupEntry { node, *text };
		lookup[lookupEntry] = newNode.index;
		node = newNode.index;
		text++;
	}

	// set value
	nodes[node].hasValue = true;
	nodes[node].value = value;
}